

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

ATTACH_HANDLE attach_clone(ATTACH_HANDLE value)

{
  AMQP_VALUE pAVar1;
  ATTACH_HANDLE local_18;
  ATTACH_INSTANCE *attach_instance;
  ATTACH_HANDLE value_local;
  
  local_18 = (ATTACH_HANDLE)malloc(8);
  if (local_18 != (ATTACH_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (ATTACH_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

ATTACH_HANDLE attach_clone(ATTACH_HANDLE value)
{
    ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)malloc(sizeof(ATTACH_INSTANCE));
    if (attach_instance != NULL)
    {
        attach_instance->composite_value = amqpvalue_clone(((ATTACH_INSTANCE*)value)->composite_value);
        if (attach_instance->composite_value == NULL)
        {
            free(attach_instance);
            attach_instance = NULL;
        }
    }

    return attach_instance;
}